

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::PausableReadAsyncIoStream::tryPumpFrom
          (PausableReadAsyncIoStream *this,AsyncInputStream *input,uint64_t amount)

{
  AsyncIoStream *pAVar1;
  Deferred<kj::Function<void_()>_> *attachments;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  Maybe<kj::Promise<unsigned_long>_> MVar2;
  Deferred<kj::Function<void_()>_> local_78;
  Promise<unsigned_long> local_60;
  Deferred<kj::Function<void_()>_> *local_58;
  Promise<unsigned_long> *r;
  Deferred<kj::Function<void_()>_> *local_40;
  Promise<unsigned_long> *_r5889;
  Maybe<kj::Promise<unsigned_long>_> result;
  uint64_t amount_local;
  AsyncInputStream *input_local;
  PausableReadAsyncIoStream *this_local;
  
  result.ptr.field_1 = in_RCX;
  pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(input + 2));
  (*(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream[2])
            ((Maybe<kj::Promise<unsigned_long>_> *)&_r5889,&pAVar1->super_AsyncOutputStream,amount,
             result.ptr.field_1);
  attachments = (Deferred<kj::Function<void_()>_> *)
                kj::_::readMaybe<kj::Promise<unsigned_long>>
                          ((Maybe<kj::Promise<unsigned_long>_> *)&_r5889);
  local_40 = attachments;
  if (attachments == (Deferred<kj::Function<void_()>_> *)0x0) {
    Maybe<kj::Promise<unsigned_long>_>::Maybe((Maybe<kj::Promise<unsigned_long>_> *)this);
  }
  else {
    local_58 = attachments;
    trackWrite(&local_78,(PausableReadAsyncIoStream *)input);
    Promise<unsigned_long>::attach<kj::_::Deferred<kj::Function<void()>>>(&local_60,attachments);
    Maybe<kj::Promise<unsigned_long>_>::Maybe((Maybe<kj::Promise<unsigned_long>_> *)this,&local_60);
    Promise<unsigned_long>::~Promise(&local_60);
    kj::_::Deferred<kj::Function<void_()>_>::~Deferred(&local_78);
  }
  Maybe<kj::Promise<unsigned_long>_>::~Maybe((Maybe<kj::Promise<unsigned_long>_> *)&_r5889);
  MVar2.ptr.field_1 = extraout_RDX;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> PausableReadAsyncIoStream::tryPumpFrom(
    kj::AsyncInputStream& input, uint64_t amount) {
  auto result = inner->tryPumpFrom(input, amount);
  KJ_IF_SOME(r, result) {
    return r.attach(trackWrite());
  } else {
    return kj::none;
  }
}